

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cBGRA,cBGRA,bOverlay>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  FSpecialColormap *pFVar3;
  EBlend EVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  
  pFVar3 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar4 = BLEND_NONE;
  }
  else {
    EVar4 = inf->blend;
  }
  switch(EVar4) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar9 = pin + 3;
      lVar5 = 0;
      do {
        bVar1 = *pbVar9;
        if (bVar1 != 0) {
          uVar8 = (uint)bVar1;
          uVar14 = uVar8 ^ 0xff;
          pout[lVar5 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 2] * uVar14 + pbVar9[-1] * uVar8) * 0x1010102 >> 0x20
                     );
          pout[lVar5 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 1] * uVar14 + pbVar9[-2] * uVar8) * 0x1010102 >> 0x20
                     );
          pout[lVar5 * 4] =
               (BYTE)((ulong)(pout[lVar5 * 4] * uVar14 + pbVar9[-3] * uVar8) * 0x1010102 >> 0x20);
          bVar12 = pout[lVar5 * 4 + 3];
          if (pout[lVar5 * 4 + 3] < bVar1) {
            bVar12 = bVar1;
          }
          pout[lVar5 * 4 + 3] = bVar12;
        }
        lVar5 = lVar5 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar5);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar9 = pin + 3;
      lVar5 = 0;
      do {
        bVar1 = *pbVar9;
        if (bVar1 != 0) {
          uVar14 = (uint)pbVar9[-2] * 0x8f + (uint)pbVar9[-1] * 0x4d +
                   ((uint)pbVar9[-3] + (uint)pbVar9[-3] * 8) * 4 >> 0xc;
          uVar8 = (uint)bVar1;
          uVar13 = uVar8 ^ 0xff;
          pout[lVar5 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 2] * uVar13 + IcePalette[uVar14][0] * uVar8) *
                      0x1010102 >> 0x20);
          pout[lVar5 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 1] * uVar13 + IcePalette[uVar14][1] * uVar8) *
                      0x1010102 >> 0x20);
          pout[lVar5 * 4] =
               (BYTE)((ulong)(pout[lVar5 * 4] * uVar13 + IcePalette[uVar14][2] * uVar8) * 0x1010102
                     >> 0x20);
          bVar12 = pout[lVar5 * 4 + 3];
          if (pout[lVar5 * 4 + 3] < bVar1) {
            bVar12 = bVar1;
          }
          pout[lVar5 * 4 + 3] = bVar12;
        }
        lVar5 = lVar5 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar5);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar9 = pin + 3;
      lVar5 = 0;
      do {
        bVar1 = *pbVar9;
        if (bVar1 != 0) {
          iVar10 = inf->blendcolor[3];
          bVar12 = pbVar9[-2];
          iVar6 = inf->blendcolor[1];
          bVar2 = pbVar9[-3];
          iVar7 = inf->blendcolor[2];
          uVar14 = (uint)bVar1;
          uVar8 = uVar14 ^ 0xff;
          pout[lVar5 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 2] * uVar8 +
                             ((uint)pbVar9[-1] * iVar10 + inf->blendcolor[0] >> 0x10 & 0xff) *
                             uVar14) * 0x1010102 >> 0x20);
          pout[lVar5 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 1] * uVar8 +
                             ((uint)bVar12 * iVar10 + iVar6 >> 0x10 & 0xff) * uVar14) * 0x1010102 >>
                     0x20);
          pout[lVar5 * 4] =
               (BYTE)((ulong)(pout[lVar5 * 4] * uVar8 +
                             ((uint)bVar2 * iVar10 + iVar7 >> 0x10 & 0xff) * uVar14) * 0x1010102 >>
                     0x20);
          bVar12 = pout[lVar5 * 4 + 3];
          if (pout[lVar5 * 4 + 3] < bVar1) {
            bVar12 = bVar1;
          }
          pout[lVar5 * 4 + 3] = bVar12;
        }
        lVar5 = lVar5 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar5);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar9 = pin + 3;
      lVar5 = 0;
      do {
        bVar1 = *pbVar9;
        if (bVar1 != 0) {
          bVar12 = pbVar9[-2];
          iVar10 = inf->blendcolor[1];
          bVar2 = pbVar9[-3];
          iVar6 = inf->blendcolor[2];
          uVar14 = (uint)bVar1;
          uVar8 = uVar14 ^ 0xff;
          pout[lVar5 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 2] * uVar8 +
                             ((uint)pbVar9[-1] * inf->blendcolor[0] >> 0x10 & 0xff) * uVar14) *
                      0x1010102 >> 0x20);
          pout[lVar5 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar5 * 4 + 1] * uVar8 +
                             ((uint)bVar12 * iVar10 >> 0x10 & 0xff) * uVar14) * 0x1010102 >> 0x20);
          pout[lVar5 * 4] =
               (BYTE)((ulong)(pout[lVar5 * 4] * uVar8 +
                             ((uint)bVar2 * iVar6 >> 0x10 & 0xff) * uVar14) * 0x1010102 >> 0x20);
          bVar12 = pout[lVar5 * 4 + 3];
          if (pout[lVar5 * 4 + 3] < bVar1) {
            bVar12 = bVar1;
          }
          pout[lVar5 * 4 + 3] = bVar12;
        }
        lVar5 = lVar5 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar5);
    }
    break;
  default:
    EVar4 = inf->blend;
    lVar5 = (long)EVar4;
    if (lVar5 < 0x21) {
      if ((BLEND_ICEMAP < EVar4) && (0 < count)) {
        iVar10 = 0x20 - EVar4;
        pbVar9 = pin + 3;
        lVar5 = 0;
        do {
          bVar1 = *pbVar9;
          if (bVar1 != 0) {
            bVar12 = pbVar9[-3];
            iVar7 = ((uint)pbVar9[-2] * 0x8f + (uint)pbVar9[-1] * 0x4d +
                     ((uint)bVar12 + (uint)bVar12 * 8) * 4 >> 8) * (EVar4 + BLEND_MODULATE);
            iVar6 = (uint)pbVar9[-1] * iVar10 + iVar7;
            iVar15 = (uint)pbVar9[-2] * iVar10 + iVar7;
            iVar7 = (uint)bVar12 * iVar10 + iVar7;
            uVar14 = (uint)bVar1;
            uVar8 = uVar14 ^ 0xff;
            pout[lVar5 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar5 * 4 + 2] * uVar8 +
                               ((uint)((ulong)((long)iVar6 * 0x84210843) >> 0x24) - (iVar6 >> 0x1f)
                               & 0xff) * uVar14) * 0x1010102 >> 0x20);
            pout[lVar5 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar5 * 4 + 1] * uVar8 +
                               ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) -
                                (iVar15 >> 0x1f) & 0xff) * uVar14) * 0x1010102 >> 0x20);
            pout[lVar5 * 4] =
                 (BYTE)((ulong)(pout[lVar5 * 4] * uVar8 +
                               ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f)
                               & 0xff) * uVar14) * 0x1010102 >> 0x20);
            bVar12 = pout[lVar5 * 4 + 3];
            if (pout[lVar5 * 4 + 3] < bVar1) {
              bVar12 = bVar1;
            }
            pout[lVar5 * 4 + 3] = bVar12;
          }
          lVar5 = lVar5 + 1;
          pbVar9 = pbVar9 + step;
        } while (count != (int)lVar5);
      }
    }
    else if (0 < count) {
      pbVar9 = pin + 3;
      lVar11 = 0;
      do {
        bVar1 = *pbVar9;
        if (bVar1 != 0) {
          uVar8 = (uint)pbVar9[-2] * 0x8f + (uint)pbVar9[-1] * 0x4d +
                  ((uint)pbVar9[-3] + (uint)pbVar9[-3] * 8) * 4;
          uVar14 = uVar8 >> 8;
          if (0xfe < uVar14) {
            uVar14 = 0xff;
          }
          uVar16 = (ulong)uVar14;
          if (uVar8 < 0x100) {
            uVar16 = 0;
          }
          bVar12 = *(byte *)((long)pFVar3 + uVar16 * 4 + lVar5 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar3 + uVar16 * 4 + lVar5 * 0x518 + -0xa6ff);
          uVar8 = (uint)bVar1;
          uVar14 = uVar8 ^ 0xff;
          pout[lVar11 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar11 * 4 + 2] * uVar14 +
                             *(byte *)((long)pFVar3 + uVar16 * 4 + lVar5 * 0x518 + -0xa6fe) * uVar8)
                      * 0x1010102 >> 0x20);
          pout[lVar11 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar11 * 4 + 1] * uVar14 + bVar2 * uVar8) * 0x1010102 >> 0x20);
          pout[lVar11 * 4] =
               (BYTE)((ulong)(pout[lVar11 * 4] * uVar14 + bVar12 * uVar8) * 0x1010102 >> 0x20);
          bVar12 = pout[lVar11 * 4 + 3];
          if (pout[lVar11 * 4 + 3] < bVar1) {
            bVar12 = bVar1;
          }
          pout[lVar11 * 4 + 3] = bVar12;
        }
        lVar11 = lVar11 + 1;
        pbVar9 = pbVar9 + step;
      } while (count != (int)lVar11);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}